

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printdfd.c
# Opt level: O3

char * dfdToStringColorModel(khr_df_model_e value)

{
  switch(value) {
  case KHR_DF_MODEL_UNSPECIFIED:
    return "KHR_DF_MODEL_UNSPECIFIED";
  case KHR_DF_MODEL_RGBSDA:
    return "KHR_DF_MODEL_RGBSDA";
  case KHR_DF_MODEL_YUVSDA:
    return "KHR_DF_MODEL_YUVSDA";
  case KHR_DF_MODEL_YIQSDA:
    return "KHR_DF_MODEL_YIQSDA";
  case KHR_DF_MODEL_LABSDA:
    return "KHR_DF_MODEL_LABSDA";
  case KHR_DF_MODEL_CMYKA:
    return "KHR_DF_MODEL_CMYKA";
  case KHR_DF_MODEL_XYZW:
    return "KHR_DF_MODEL_XYZW";
  case KHR_DF_MODEL_HSVA_ANG:
    return "KHR_DF_MODEL_HSVA_ANG";
  case KHR_DF_MODEL_HSLA_ANG:
    return "KHR_DF_MODEL_HSLA_ANG";
  case KHR_DF_MODEL_HSVA_HEX:
    return "KHR_DF_MODEL_HSVA_HEX";
  case KHR_DF_MODEL_HSLA_HEX:
    return "KHR_DF_MODEL_HSLA_HEX";
  case KHR_DF_MODEL_YCGCOA:
    return "KHR_DF_MODEL_YCGCOA";
  case KHR_DF_MODEL_YCCBCCRC:
    return "KHR_DF_MODEL_YCCBCCRC";
  case KHR_DF_MODEL_ICTCP:
    return "KHR_DF_MODEL_ICTCP";
  case KHR_DF_MODEL_CIEXYZ:
    return "KHR_DF_MODEL_CIEXYZ";
  case KHR_DF_MODEL_CIEXYY:
    return "KHR_DF_MODEL_CIEXYY";
  }
  switch(value) {
  case KHR_DF_MODEL_BC1A:
    return "KHR_DF_MODEL_BC1A";
  case KHR_DF_MODEL_BC2:
    return "KHR_DF_MODEL_BC2";
  case KHR_DF_MODEL_BC3:
    return "KHR_DF_MODEL_BC3";
  case KHR_DF_MODEL_ATI1N:
    return "KHR_DF_MODEL_BC4";
  case KHR_DF_MODEL_ATI2N_XY:
    return "KHR_DF_MODEL_BC5";
  case KHR_DF_MODEL_BC6H:
    return "KHR_DF_MODEL_BC6H";
  case KHR_DF_MODEL_BC7:
    return "KHR_DF_MODEL_BC7";
  default:
    switch(value) {
    case KHR_DF_MODEL_ETC1:
      return "KHR_DF_MODEL_ETC1";
    case KHR_DF_MODEL_ETC2:
      return "KHR_DF_MODEL_ETC2";
    case KHR_DF_MODEL_ASTC:
      return "KHR_DF_MODEL_ASTC";
    case KHR_DF_MODEL_ETC1S:
      return "KHR_DF_MODEL_ETC1S";
    case KHR_DF_MODEL_PVRTC:
      return "KHR_DF_MODEL_PVRTC";
    case KHR_DF_MODEL_PVRTC2:
      return "KHR_DF_MODEL_PVRTC2";
    case KHR_DF_MODEL_UASTC:
      return "KHR_DF_MODEL_UASTC";
    default:
      return (char *)0x0;
    }
  }
}

Assistant:

const char* dfdToStringColorModel(khr_df_model_e value) {
    switch (value) {
    case KHR_DF_MODEL_UNSPECIFIED:
        return "KHR_DF_MODEL_UNSPECIFIED";
    case KHR_DF_MODEL_RGBSDA:
        return "KHR_DF_MODEL_RGBSDA";
    case KHR_DF_MODEL_YUVSDA:
        return "KHR_DF_MODEL_YUVSDA";
    case KHR_DF_MODEL_YIQSDA:
        return "KHR_DF_MODEL_YIQSDA";
    case KHR_DF_MODEL_LABSDA:
        return "KHR_DF_MODEL_LABSDA";
    case KHR_DF_MODEL_CMYKA:
        return "KHR_DF_MODEL_CMYKA";
    case KHR_DF_MODEL_XYZW:
        return "KHR_DF_MODEL_XYZW";
    case KHR_DF_MODEL_HSVA_ANG:
        return "KHR_DF_MODEL_HSVA_ANG";
    case KHR_DF_MODEL_HSLA_ANG:
        return "KHR_DF_MODEL_HSLA_ANG";
    case KHR_DF_MODEL_HSVA_HEX:
        return "KHR_DF_MODEL_HSVA_HEX";
    case KHR_DF_MODEL_HSLA_HEX:
        return "KHR_DF_MODEL_HSLA_HEX";
    case KHR_DF_MODEL_YCGCOA:
        return "KHR_DF_MODEL_YCGCOA";
    case KHR_DF_MODEL_YCCBCCRC:
        return "KHR_DF_MODEL_YCCBCCRC";
    case KHR_DF_MODEL_ICTCP:
        return "KHR_DF_MODEL_ICTCP";
    case KHR_DF_MODEL_CIEXYZ:
        return "KHR_DF_MODEL_CIEXYZ";
    case KHR_DF_MODEL_CIEXYY:
        return "KHR_DF_MODEL_CIEXYY";
    case KHR_DF_MODEL_BC1A:
    // case KHR_DF_MODEL_DXT1A: // Fallthrough, Matching values
        return "KHR_DF_MODEL_BC1A";
    case KHR_DF_MODEL_BC2:
    // case KHR_DF_MODEL_DXT2: // Fallthrough, Matching values
    // case KHR_DF_MODEL_DXT3: // Fallthrough, Matching values
        return "KHR_DF_MODEL_BC2";
    case KHR_DF_MODEL_BC3:
    // case KHR_DF_MODEL_DXT4: // Fallthrough, Matching values
    // case KHR_DF_MODEL_DXT5: // Fallthrough, Matching values
        return "KHR_DF_MODEL_BC3";
    case KHR_DF_MODEL_BC4:
        return "KHR_DF_MODEL_BC4";
    case KHR_DF_MODEL_BC5:
        return "KHR_DF_MODEL_BC5";
    case KHR_DF_MODEL_BC6H:
        return "KHR_DF_MODEL_BC6H";
    case KHR_DF_MODEL_BC7:
        return "KHR_DF_MODEL_BC7";
    case KHR_DF_MODEL_ETC1:
        return "KHR_DF_MODEL_ETC1";
    case KHR_DF_MODEL_ETC2:
        return "KHR_DF_MODEL_ETC2";
    case KHR_DF_MODEL_ASTC:
        return "KHR_DF_MODEL_ASTC";
    case KHR_DF_MODEL_ETC1S:
        return "KHR_DF_MODEL_ETC1S";
    case KHR_DF_MODEL_PVRTC:
        return "KHR_DF_MODEL_PVRTC";
    case KHR_DF_MODEL_PVRTC2:
        return "KHR_DF_MODEL_PVRTC2";
    case KHR_DF_MODEL_UASTC:
        return "KHR_DF_MODEL_UASTC";

    case KHR_DF_MODEL_MAX:
        // These enum values are not meant for string representation. Ignore
        break;
    }
    return NULL;
}